

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O2

void nes_inesprg(int *ip)

{
  int iVar1;
  
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (0x40 < value) {
      error("Prg bank value out of range!");
      return;
    }
    ines_prg = value;
    if (pass == 1) {
      println();
      return;
    }
  }
  return;
}

Assistant:

void
nes_inesprg(int *ip)
{
	if (!evaluate(ip, ';'))
		return;
    int svalue = (int)value;
	if ((svalue < 0) || (svalue > 64)) 
	{
		error("Prg bank value out of range!");
	
		return;
	}
	
	ines_prg = value;

	if (pass == LAST_PASS) 
	{
		println();
	}
}